

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O3

void __thiscall APITests::test_setup_one_board(APITests *this)

{
  int iVar1;
  string local_60;
  string local_40;
  
  GPIO::setmode(BOARD);
  iVar1 = GPIO::getmode();
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  assert::is_true(iVar1 == 0,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  GPIO::setup((this->pin_data).in_a,IN,-1);
  GPIO::cleanup();
  iVar1 = GPIO::getmode();
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  assert::is_true(iVar1 == 4,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void test_setup_one_board()
    {
        GPIO::setmode(GPIO::BOARD);
        assert::is_true(GPIO::getmode() == GPIO::BOARD);
        GPIO::setup(pin_data.in_a, GPIO::IN);
        GPIO::cleanup();
        assert::is_true(GPIO::getmode() == GPIO::NumberingModes::None);
    }